

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.h
# Opt level: O3

void __thiscall
embree::CommandLineParser::
CommandLineOptionClosure<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/verify/verify.cpp:6847:27)>
::parse(CommandLineOptionClosure<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_verify_verify_cpp:6847:27)>
        *this,Ref<embree::ParseStream> *cin,FileName *path)

{
  ParseStream *this_00;
  VerifyApplication *this_01;
  Test *pTVar1;
  size_t sVar2;
  ostream *poVar3;
  string regex;
  Ref<embree::VerifyApplication::Test> local_70;
  Ref<embree::VerifyApplication::Test> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  this_00 = cin->ptr;
  if (this_00 != (ParseStream *)0x0) {
    (*(this_00->
      super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).super_RefCount._vptr_RefCount[2])(this_00);
  }
  this_01 = (this->f).this;
  if (this_01->user_specified_tests == false) {
    pTVar1 = (this_01->tests).ptr;
    local_68.ptr = pTVar1;
    if (pTVar1 != (Test *)0x0) {
      (*(pTVar1->super_RefCount)._vptr_RefCount[2])(pTVar1);
    }
    VerifyApplication::enable_disable_all_tests(this_01,&local_68,false);
    if (pTVar1 != (Test *)0x0) {
      (*(pTVar1->super_RefCount)._vptr_RefCount[3])(pTVar1);
    }
  }
  this_01->user_specified_tests = true;
  Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::get
            (&local_60,
             &this_00->
              super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            );
  pTVar1 = (this_01->tests).ptr;
  local_70.ptr = pTVar1;
  if (pTVar1 != (Test *)0x0) {
    (*(pTVar1->super_RefCount)._vptr_RefCount[2])(pTVar1);
  }
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,local_60._M_dataplus._M_p,
             local_60._M_dataplus._M_p + local_60._M_string_length);
  sVar2 = VerifyApplication::enable_disable_some_tests(this_01,&local_70,&local_40,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if (pTVar1 != (Test *)0x0) {
    (*(pTVar1->super_RefCount)._vptr_RefCount[3])(pTVar1);
  }
  if (sVar2 != 0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    (*(this_00->
      super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).super_RefCount._vptr_RefCount[3])(this_00);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"no tests matched regular expression ",0x24);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_60._M_dataplus._M_p,local_60._M_string_length);
  std::endl<char,std::char_traits<char>>(poVar3);
  exit(1);
}

Assistant:

virtual void parse(Ref<ParseStream> cin, const FileName& path) {
        f(cin,path);
      }